

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_tcp_connect(NETSOCKET sock,NETADDR *a)

{
  NETADDR *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  sockaddr_in6 addr_1;
  sockaddr_in addr;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_54;
  int iStack_3c;
  sockaddr local_34;
  sockaddr local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX->type & 1) == 0) {
    if ((in_RDX->type & 2) == 0) {
      local_54 = -1;
    }
    else {
      netaddr_to_sockaddr_in6
                (in_RDX,(sockaddr_in6 *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_54 = connect(in_ESI,&local_34,0x1c);
    }
  }
  else {
    netaddr_to_sockaddr_in
              (in_RDX,(sockaddr_in *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iStack_3c = (int)((ulong)in_RDI >> 0x20);
    local_54 = connect(iStack_3c,&local_18,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_connect(NETSOCKET sock, const NETADDR *a)
{
	if(a->type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		netaddr_to_sockaddr_in(a, &addr);
		return connect(sock.ipv4sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	if(a->type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		netaddr_to_sockaddr_in6(a, &addr);
		return connect(sock.ipv6sock, (struct sockaddr *)&addr, sizeof(addr));
	}

	return -1;
}